

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::PrintStats(ScriptContext *this)

{
  uint uVar1;
  int iVar2;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar3;
  Type pcVar4;
  long *plVar5;
  BailoutStatsMap *pBVar6;
  Type pSVar7;
  ParseableFunctionInfo *pPVar8;
  RejitStats *pRVar9;
  Type piVar10;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *pWVar11;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
  *pSVar12;
  CacheDataMap *pCVar13;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
  *pSVar14;
  PolymorphicInlineCache *pPVar15;
  RegexStatsDatabase *this_00;
  FunctionBody *this_01;
  EntryPointInfo *this_02;
  SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar16;
  LoopEntryPointInfo *this_03;
  code *pcVar17;
  undefined4 uVar18;
  undefined1 auVar19 [8];
  RejitStatsMap *pRVar20;
  bool bVar21;
  byte bVar22;
  uint i_5;
  uint32 uVar23;
  uint uVar24;
  RejitStatsMap *pRVar25;
  undefined4 *puVar26;
  char *pcVar27;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar28;
  char16 *pcVar29;
  Type *pTVar30;
  DebugWriter *w;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar31;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ptrdiff_t pVar32;
  LoopHeader *pLVar33;
  int iVar34;
  FieldAccessStatsEntry *pFVar35;
  FieldAccessStatsByFunctionNumberMap *pFVar36;
  long lVar37;
  uint *puVar38;
  ulong uVar39;
  int j;
  uint uVar40;
  uint uVar41;
  long lVar42;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *pWVar43;
  char16_t *pcVar44;
  int iVar45;
  ulong uVar46;
  RejitStatsMap *pRVar47;
  ScriptContext *pSVar48;
  char16_t *pcVar49;
  int j_1;
  ulong uVar50;
  uint uVar51;
  uint i;
  undefined1 auStack_7a8 [8];
  uint totalBuckets [15];
  undefined1 auStack_5a8 [8];
  char16 debugStringBuffer_1 [42];
  undefined1 auStack_3a8 [8];
  char16 debugStringBuffer [42];
  uint auStack_1a8 [2];
  uint usedNativeCodeBuckets [15];
  uint rejits [15];
  uint nativeCodeBuckets [15];
  uint local_8c;
  uint local_88;
  uint oneInterpretedFunctions;
  uint nonZeroBytecodeFunctions;
  long *local_78;
  uint local_6c;
  RejitStatsMap *local_68;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *local_60;
  FieldAccessStatsByFunctionNumberMap *local_58;
  ScriptContext *local_50;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *local_48;
  RejitStatsMap *local_40;
  FieldAccessStatsEntry *local_38;
  double pct;
  
  if (DAT_0144d961 == '\x01') {
    ProfileTypes(this);
  }
  if (DAT_0144d963 == '\x01') {
    Output::Print(L"CodeSize: %6d\nBailOutRecord Size: %6d\nLocalOffsets Size: %6d\n",this->codeSize
                  ,this->bailOutRecordBytes);
  }
  if (DAT_0144d954 == '\x01') {
    ProfileObjectLiteral(this);
  }
  if (this->stringProfiler != (StringProfiler *)0x0) {
    StringProfiler::PrintAll(this->stringProfiler);
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::StringProfiler>
              (&this->miscAllocator,this->stringProfiler);
    this->stringProfiler = (StringProfiler *)0x0;
  }
  if ((this->profileMemoryDump == true) && (bVar21 = MemoryProfiler::IsTraceEnabled(false), bVar21))
  {
    MemoryProfiler::PrintAll();
    bVar21 = Phases::IsEnabled((Phases *)&DAT_014565e0,AllPhase);
    if ((bVar21) || (bVar21 = Phases::IsEnabled((Phases *)&DAT_014565e0,RunPhase), bVar21)) {
      Memory::Recycler::PrintAllocStats(this->recycler);
    }
  }
  bVar21 = Phases::IsEnabled((Phases *)&DAT_01450888,ByteCodePhase);
  if (bVar21) {
    Output::Print(L" Total Bytecode size: <%d, %d, %d> = %d\n");
  }
  local_50 = this;
  if (DAT_014303c8 == '\x01') {
    Output::Print(L"ByteCode Histogram\n");
    Output::Print(L"\n");
    iVar34 = 0;
    uVar51 = 0;
    for (lVar42 = 0; lVar42 != 0x189; lVar42 = lVar42 + 1) {
      uVar51 = uVar51 + this->byteCodeHistogram[lVar42];
      iVar34 = (iVar34 + 1) - (uint)(this->byteCodeHistogram[lVar42] == 0);
    }
    local_60 = (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
                *)CONCAT44(local_60._4_4_,iVar34);
    Output::Print(L"%9u                     Total executed ops\n",(ulong)uVar51);
    Output::Print(L"\n");
    local_58 = (FieldAccessStatsByFunctionNumberMap *)(double)uVar51;
    local_40 = (RejitStatsMap *)0x0;
    uVar51 = 0xffffffff;
    while( true ) {
      uVar40 = 0;
      uVar46 = 0xffffffffffffffff;
      for (uVar50 = 0; uVar50 != 0x189; uVar50 = uVar50 + 1) {
        bVar21 = OpCodeUtil::IsValidOpcode((OpCode)uVar50);
        if (bVar21) {
          uVar1 = local_50->byteCodeHistogram[uVar50];
          uVar41 = uVar40;
          if (uVar40 < uVar1 && uVar1 < uVar51) {
            uVar41 = uVar1;
          }
          uVar46 = uVar46 & 0xffffffff;
          bVar21 = uVar40 < uVar1;
          uVar40 = uVar41;
          if (bVar21 && uVar1 < uVar51) {
            uVar46 = uVar50 & 0xffffffff;
          }
        }
      }
      if ((int)uVar46 == -1) break;
      uVar51 = local_50->byteCodeHistogram[(int)uVar46];
      local_38 = (FieldAccessStatsEntry *)((double)uVar51 / (double)local_58);
      local_68 = (RejitStatsMap *)((double)local_38 * 100.0);
      for (uVar46 = 0; uVar46 != 0x189; uVar46 = uVar46 + 1) {
        bVar21 = OpCodeUtil::IsValidOpcode((OpCode)uVar46);
        if ((bVar21) && (uVar51 == local_50->byteCodeHistogram[uVar46])) {
          local_40 = (RejitStatsMap *)((double)local_40 + (double)local_38);
          local_48 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                      *)((double)local_40 * 100.0);
          OpCodeUtil::GetOpCodeName((OpCode)uVar46);
          Output::Print(L"%9u  %5.1lf  %5.1lf  %04x %s\n",(int)local_68,local_48,(ulong)uVar51,
                        uVar46 & 0xffff);
        }
      }
    }
    Output::Print(L"\n");
    Output::Print(L"Unique opcodes: %d\n",(ulong)local_60 & 0xffffffff);
  }
  pSVar48 = local_50;
  bVar21 = Phases::IsEnabled((Phases *)&DAT_01450888,BGJitPhase);
  if ((bVar21) &&
     ((0x32 < pSVar48->interpretedCount ||
      (bVar21 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ForceFlag),
      bVar21)))) {
    totalBuckets[10] = 0;
    totalBuckets[0xb] = 0;
    totalBuckets[0xc] = 0;
    totalBuckets[6] = 0;
    totalBuckets[7] = 0;
    totalBuckets[8] = 0;
    totalBuckets[9] = 0;
    totalBuckets[2] = 0;
    totalBuckets[3] = 0;
    totalBuckets[4] = 0;
    totalBuckets[5] = 0;
    auStack_7a8 = (undefined1  [8])0x0;
    totalBuckets[0] = 0;
    totalBuckets[1] = 0;
    stack0xfffffffffffffed8 = (SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> *)0x0;
    usedNativeCodeBuckets[10] = 0;
    usedNativeCodeBuckets[0xb] = 0;
    usedNativeCodeBuckets[0xc] = 0;
    usedNativeCodeBuckets[6] = 0;
    usedNativeCodeBuckets[7] = 0;
    usedNativeCodeBuckets[8] = 0;
    usedNativeCodeBuckets[9] = 0;
    usedNativeCodeBuckets[2] = 0;
    usedNativeCodeBuckets[3] = 0;
    usedNativeCodeBuckets[4] = 0;
    usedNativeCodeBuckets[5] = 0;
    usedNativeCodeBuckets[0] = 0;
    usedNativeCodeBuckets[1] = 0;
    rejits[10] = 0;
    rejits[0xb] = 0;
    rejits[0xc] = 0;
    rejits[6] = 0;
    rejits[7] = 0;
    rejits[8] = 0;
    rejits[9] = 0;
    rejits[2] = 0;
    rejits[3] = 0;
    rejits[4] = 0;
    rejits[5] = 0;
    stack0xfffffffffffffe98 = 0;
    rejits[0] = 0;
    rejits[1] = 0;
    local_8c = 0;
    local_88 = 0;
    local_58 = (FieldAccessStatsByFunctionNumberMap *)0x0;
    Output::Print(L"Script Context: 0x%p Url: %s\n",pSVar48,pSVar48->url);
    local_60 = (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
                *)&pSVar48->sourceList;
    pRVar25 = (RejitStatsMap *)
              Memory::
              RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
              ::operator->((RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                            *)local_60);
    puVar26 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    pFVar35 = (FieldAccessStatsEntry *)0x0;
    local_68 = pRVar25;
    while ((long)pFVar35 < (long)*(int *)&(local_68->entries).ptr) {
      pRVar3 = ((Type *)&local_68->buckets)->ptr[(long)pFVar35].ptr;
      local_38 = pFVar35;
      if (((((ulong)pRVar3 & 1) == 0 && pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
          && (pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef, pcVar4 != (Type)0x0)) &&
         (plVar5 = *(long **)(pcVar4 + 0x18), plVar5 != (long *)0x0)) {
        local_48 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                    *)0x0;
        pRVar25 = (RejitStatsMap *)0x0;
        while (pRVar25 < (RejitStatsMap *)(ulong)*(uint *)((long)plVar5 + 0x1c)) {
          iVar34 = *(int *)(*plVar5 + (long)pRVar25 * 4);
          pSVar28 = local_48;
          local_40 = pRVar25;
          if (iVar34 != -1) {
            while (local_48 = pSVar28, iVar34 != -1) {
              lVar42 = (long)iVar34;
              iVar34 = *(int *)(plVar5[1] + 8 + lVar42 * 0x10);
              pSVar28 = *(SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                          **)(plVar5[1] + lVar42 * 0x10);
              if (pSVar28 ==
                  (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                   *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar26 = 1;
                bVar21 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                             ,199,"(functionBody)","functionBody");
                if (!bVar21) goto LAB_006ed27c;
                *puVar26 = 0;
                pSVar28 = local_48;
              }
            }
          }
          pRVar25 = (RejitStatsMap *)((long)&local_40->size + 1);
        }
        if (local_48 !=
            (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
             *)0x0) {
          if (DAT_0145948a == 1) {
            Output::TraceStats(BGJitPhase,L"Function list\n");
          }
          if ((DAT_0145948a & 1) != 0) {
            Output::TraceStats(BGJitPhase,L"===============================\n");
          }
          if ((DAT_0145948a & 1) != 0) {
            Output::TraceStats(BGJitPhase,L"%-24s, %-8s, %-10s, %-10s, %-10s, %-10s, %-10s\n",
                               L"Function",L"InterpretedCount",L"ByteCodeInLoopSize",L"ByteCodeSize"
                               ,L"IsJitted",L"IsUsed",L"NativeCodeSize");
          }
          uVar46 = 0;
          uVar51 = 0;
          uVar50 = 0;
          if (*(List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                **)local_60 !=
              (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
               *)0x0) {
            pLVar31 = Memory::
                      RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                      ::operator->((RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                                    *)local_60);
            uVar50 = 0;
            for (lVar42 = 0;
                lVar42 < (pLVar31->
                         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                         ).count; lVar42 = lVar42 + 1) {
              pRVar3 = (pLVar31->
                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                       ).buffer.ptr[lVar42].ptr;
              if (((((ulong)pRVar3 & 1) == 0 &&
                    pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
                  (pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef, pcVar4 != (Type)0x0
                  )) && (plVar5 = *(long **)(pcVar4 + 0x18), plVar5 != (long *)0x0)) {
                local_78 = plVar5;
                for (uVar46 = 0; uVar46 < *(uint *)((long)local_78 + 0x1c); uVar46 = uVar46 + 1) {
                  uVar24 = *(uint *)(*local_78 + uVar46 * 4);
                  if (uVar24 != 0xffffffff) {
                    do {
                      oneInterpretedFunctions = uVar24;
                      local_40 = (RejitStatsMap *)CONCAT44(local_40._4_4_,(int)uVar50);
                      do {
                        if (oneInterpretedFunctions == 0xffffffff) goto LAB_006ed245;
                        lVar37 = (long)(int)oneInterpretedFunctions;
                        oneInterpretedFunctions = *(uint *)(local_78[1] + 8 + lVar37 * 0x10);
                        this_01 = *(FunctionBody **)(local_78[1] + lVar37 * 0x10);
                        if (this_01 == (FunctionBody *)0x0) {
                          AssertCount = AssertCount + 1;
                          Throw::LogAssert();
                          *puVar26 = 1;
                          bVar21 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                  ,0xa2,"(functionBody)","functionBody");
                          if (!bVar21) goto LAB_006ed27c;
                          *puVar26 = 0;
                        }
                        uVar23 = FunctionBody::GetInterpretedCount(this_01);
                        if (((uVar23 < 2) &&
                            (bVar21 = ConfigFlagsTable::IsEnabled
                                                ((ConfigFlagsTable *)&Configuration::Global,
                                                 ForceFlag), !bVar21)) ||
                           (pSVar28 = (this_01->entryPoints).ptr,
                           pSVar28 ==
                           (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                            *)0x0)) {
                          pFVar35 = (FieldAccessStatsEntry *)0x0;
                        }
                        else {
                          pFVar35 = (FieldAccessStatsEntry *)0x0;
                          local_6c = uVar51;
                          local_48 = pSVar28;
                          for (lVar37 = 0; uVar51 = local_6c,
                              lVar37 < (pSVar28->
                                       super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                       ).
                                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                                       .count; lVar37 = lVar37 + 1) {
                            this_02 = (EntryPointInfo *)
                                      (((pSVar28->
                                        super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                        ).
                                        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                                        .buffer.ptr[lVar37].ptr)->super_RecyclerWeakReferenceBase).
                                      strongRef;
                            if (this_02 != (EntryPointInfo *)0x0) {
                              bVar22 = EntryPointInfo::IsNativeCode(this_02);
                              if (DAT_0145948a == 1) {
                                local_68 = (RejitStatsMap *)CONCAT71(local_68._1_7_,bVar22);
                                local_38 = pFVar35;
                                local_58 = (FieldAccessStatsByFunctionNumberMap *)
                                           ParseableFunctionInfo::GetExternalDisplayName
                                                     (&this_01->super_ParseableFunctionInfo);
                                local_60 = (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
                                            *)FunctionProxy::GetDebugNumberSet
                                                        ((FunctionProxy *)this_01,
                                                         (wchar (*) [42])auStack_3a8);
                                uVar51 = 0x2a;
                                if (lVar37 == 0) {
                                  uVar51 = 0x20;
                                }
                                uVar23 = FunctionBody::GetInterpretedCount(this_01);
                                uVar24 = FunctionBody::GetByteCodeInLoopCount(this_01);
                                _nonZeroBytecodeFunctions =
                                     (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
                                      *)CONCAT44(extraout_var,uVar24);
                                uVar24 = FunctionBody::GetByteCodeCount(this_01);
                                bVar21 = EntryPointInfo::IsNativeCode(this_02);
                                pcVar44 = L"Interpreted";
                                if (bVar21) {
                                  pcVar44 = L"Jitted";
                                }
                                pcVar49 = L"Used";
                                if ((this_01->field_0x178 & 2) == 0) {
                                  pcVar49 = L"NotUsed";
                                }
                                bVar21 = EntryPointInfo::IsNativeCode(this_02);
                                if (bVar21) {
                                  pVar32 = EntryPointInfo::GetCodeSize(this_02);
                                }
                                else {
                                  pVar32 = 0;
                                }
                                Output::TraceStats(BGJitPhase,
                                                                                                      
                                                  L"%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"
                                                  ,local_58,local_60,(ulong)uVar51,uVar23,
                                                  _nonZeroBytecodeFunctions,
                                                  CONCAT44(extraout_var_00,uVar24),pcVar44,pcVar49,
                                                  pVar32);
                                uVar50 = (ulong)local_40 & 0xffffffff;
                                pFVar35 = local_38;
                                bVar22 = (byte)local_68;
                              }
                              pFVar35 = (FieldAccessStatsEntry *)
                                        CONCAT71((int7)((ulong)pFVar35 >> 8),(byte)pFVar35 | bVar22)
                              ;
                              pSVar28 = local_48;
                            }
                          }
                        }
                        uVar23 = FunctionBody::GetInterpretedCount(this_01);
                        if (uVar23 == 0) {
                          uVar51 = uVar51 + 1;
                          uVar24 = FunctionBody::GetByteCodeCount(this_01);
                          puVar38 = &local_88;
                          if (uVar24 != 0) goto LAB_006ed028;
                        }
                        else {
                          uVar23 = FunctionBody::GetInterpretedCount(this_01);
                          puVar38 = &local_8c;
                          if (uVar23 == 1) {
LAB_006ed028:
                            *puVar38 = *puVar38 + 1;
                          }
                        }
                        uVar23 = FunctionBody::GetInterpretedCount(this_01);
                        if (uVar23 < 100) {
                          uVar39 = (ulong)(byte)(((ushort)uVar23 & 0xff) / 0x14);
                        }
                        else {
                          uVar39 = 0xe;
                          if (uVar23 < 1000) {
                            uVar39 = (ulong)(ushort)((short)((uVar23 & 0xffff) / 100) + 4);
                          }
                        }
                        totalBuckets[uVar39 - 2] = totalBuckets[uVar39 - 2] + 1;
                        if (((ulong)pFVar35 & 1) != 0) {
                          rejits[uVar39 + 0xe] = rejits[uVar39 + 0xe] + 1;
                          if ((this_01->field_0x178 & 2) != 0) {
                            usedNativeCodeBuckets[uVar39 - 2] =
                                 usedNativeCodeBuckets[uVar39 - 2] + 1;
                          }
                          pSVar28 = (this_01->entryPoints).ptr;
                          if ((pSVar28 !=
                               (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                                *)0x0) &&
                             (1 < (pSVar28->
                                  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                  ).
                                  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                                  .count)) {
                            usedNativeCodeBuckets[uVar39 + 0xe] =
                                 usedNativeCodeBuckets[uVar39 + 0xe] + 1;
                          }
                        }
                        pLVar33 = FunctionProxy::
                                  GetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                                            ((FunctionProxy *)this_01);
                      } while (pLVar33 == (LoopHeader *)0x0);
                      uVar24 = FunctionBody::GetLoopCount(this_01);
                      _nonZeroBytecodeFunctions =
                           (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
                            *)(ulong)uVar24;
                      pWVar43 = (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
                                 *)0x0;
                      local_6c = uVar51;
                      while (uVar24 = oneInterpretedFunctions, pWVar43 != _nonZeroBytecodeFunctions)
                      {
                        local_60 = pWVar43;
                        FunctionBody::GetLoopBodyName
                                  (this_01,(uint)pWVar43,(WCHAR *)auStack_3a8,0x100);
                        pSVar16 = pLVar33[(long)pWVar43].entryPoints.ptr;
                        if (pSVar16 !=
                            (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                             *)0x0) {
                          for (lVar37 = 0; iVar34 = (int)uVar50, uVar51 = local_6c,
                              lVar37 < (pSVar16->
                                       super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                       ).
                                       super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                                       .count; lVar37 = lVar37 + 1) {
                            this_03 = (pSVar16->
                                      super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                      ).
                                      super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                                      .buffer.ptr[lVar37].ptr;
                            if ((this_03 != (LoopEntryPointInfo *)0x0) &&
                               (bVar21 = EntryPointInfo::IsNativeCode
                                                   (&this_03->super_EntryPointInfo), bVar21)) {
                              if (DAT_0145948a == 1) {
                                local_48 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                                            *)FunctionProxy::GetDebugNumberSet
                                                        ((FunctionProxy *)this_01,
                                                         (wchar (*) [42])auStack_5a8);
                                uVar18 = 0x2a;
                                if (lVar37 == 0) {
                                  uVar18 = 0x20;
                                }
                                local_68 = (RejitStatsMap *)CONCAT44(local_68._4_4_,uVar18);
                                local_38 = (FieldAccessStatsEntry *)
                                           (ulong)(pLVar33[(long)pWVar43].endOffset -
                                                  pLVar33[(long)pWVar43].startOffset);
                                local_58 = (FieldAccessStatsByFunctionNumberMap *)
                                           CONCAT44(local_58._4_4_,
                                                    pLVar33[(long)pWVar43].interpretCount);
                                local_40 = (RejitStatsMap *)CONCAT44(local_40._4_4_,iVar34);
                                pcVar44 = L"NotUsed";
                                if (this_03->used != false) {
                                  pcVar44 = L"Used";
                                }
                                pVar32 = EntryPointInfo::GetCodeSize(&this_03->super_EntryPointInfo)
                                ;
                                iVar34 = (int)local_40;
                                Output::TraceStats(BGJitPhase,
                                                                                                      
                                                  L"%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"
                                                  ,auStack_3a8,local_48,(ulong)local_68 & 0xffffffff
                                                  ,(ulong)local_58 & 0xffffffff,local_38,local_38,
                                                  L"Jitted",pcVar44,pVar32);
                              }
                              uVar50 = (ulong)(iVar34 + (uint)this_03->used);
                            }
                          }
                        }
                        pWVar43 = (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
                                   *)&((UnitPhase *)&local_60->hash)->field_0x1;
                      }
                    } while( true );
                  }
LAB_006ed245:
                }
              }
            }
            uVar46 = (ulong)local_8c;
            local_58 = (FieldAccessStatsByFunctionNumberMap *)(ulong)local_88;
          }
          goto LAB_006ec02b;
        }
      }
      pFVar35 = (FieldAccessStatsEntry *)((long)&(local_38->functionBodyWeakRef).ptr + 1);
    }
    uVar46 = 0;
    uVar51 = 0;
    uVar50 = 0;
LAB_006ec02b:
    pSVar48 = local_50;
    Output::Print(L"**  SpeculativelyJitted: %6d FunctionsJitted: %6d JittedUsed: %6d Usage:%f ByteCodesJitted: %6d JitCodeUsed: %6d Usage: %f \n"
                  ,SUB84((double)(((float)local_50->funcJitCodeUsed / (float)local_50->funcJITCount)
                                 * 100.0),0),
                  (double)(((float)local_50->jitCodeUsed / (float)local_50->bytecodeJITCount) *
                          100.0),(ulong)local_50->speculativeJitCount);
    Output::Print(L"** LoopJITCount: %6d LoopJitCodeUsed: %6d Usage: %f\n",
                  SUB84((double)(((float)uVar50 / (float)pSVar48->loopJITCount) * 100.0),0),
                  (ulong)pSVar48->loopJITCount,uVar50);
    Output::Print(L"** TotalInterpretedCalls: %6d MaxFuncInterp: %6d  InterpretedHighPri: %6d \n",
                  (ulong)pSVar48->interpretedCount,(ulong)pSVar48->maxFuncInterpret,
                  (ulong)pSVar48->interpretedCallsHighPri);
    Output::Print(L"** ZeroInterpretedFunctions: %6d OneInterpretedFunctions: %6d ZeroInterpretedWithNonZeroBytecode: %6d \n "
                  ,(ulong)uVar51,uVar46,local_58);
    Output::Print(L"** %-24s : %-10s %-10s %-10s %-10s %-10s\n",L"InterpretedCounts",L"Total",
                  L"NativeCode",L"Used",L"Usage",L"Rejits");
    uVar46 = 0;
    for (uVar50 = 0; uVar50 != 0xf; uVar50 = uVar50 + 1) {
      uVar51 = (int)uVar46 + 100;
      if (uVar50 == 0xe) {
        uVar51 = 100000;
      }
      if (uVar50 < 5) {
        uVar51 = (int)uVar46 + 0x14;
      }
      Output::Print(L"** %10d - %10d : %10d %10d %10d %7.2f %10d\n",
                    SUB84((double)(((float)usedNativeCodeBuckets[uVar50 - 2] /
                                   (float)rejits[uVar50 + 0xe]) * 100.0),0),uVar46,(ulong)uVar51,
                    (ulong)totalBuckets[uVar50 - 2],(ulong)rejits[uVar50 + 0xe],
                    (ulong)usedNativeCodeBuckets[uVar50 - 2],
                    (ulong)usedNativeCodeBuckets[uVar50 + 0xe]);
      uVar46 = (ulong)uVar51;
    }
    Output::Print(L"\n\n");
  }
  bVar21 = Phases::IsEnabled((Phases *)&DAT_01450888,ReJITPhase);
  if (bVar21) {
    Output::Print(L"%-40s %6s\n",L"Bailout Reason,",L"Count");
    pBVar6 = pSVar48->bailoutReasonCounts;
    uVar51 = 0;
    pRVar25 = (RejitStatsMap *)0x0;
    while (pRVar25 < (RejitStatsMap *)(ulong)pBVar6->bucketCount) {
      iVar34 = pBVar6->buckets[(long)pRVar25];
      local_40 = pRVar25;
      if (pBVar6->buckets[(long)pRVar25] != -1) {
        while (iVar34 != -1) {
          pSVar7 = pBVar6->entries;
          uVar40 = pSVar7[iVar34].
                   super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value;
          iVar45 = pSVar7[iVar34].
                   super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
          if (uVar40 != 0) {
            pcVar27 = GetBailOutKindName(pSVar7[iVar34].
                                         super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                         .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                         super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                         .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>
                                         .key);
            swprintf_s<256ul>((WCHAR (*) [256])auStack_3a8,L"%S,",pcVar27);
            Output::Print(L"%-40s %6d\n",(WCHAR (*) [256])auStack_3a8,(ulong)uVar40);
          }
          uVar51 = uVar51 + uVar40;
          iVar34 = iVar45;
        }
      }
      pRVar25 = (RejitStatsMap *)((long)&local_40->size + 1);
    }
    Output::Print(L"%-40s %6d\n",L"TOTAL,",(ulong)uVar51);
    Output::Print(L"\n\n");
    Output::Print(L"%-40s %6s\n",L"Rejit Reason,",L"Count");
    pSVar48 = local_50;
    local_48 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                *)0x2d;
    uVar51 = 0;
    for (pSVar28 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                    *)0x0; local_48 != pSVar28;
        pSVar28 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                   *)((long)&(pSVar28->
                             super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                             ).
                             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                             ._vptr_ReadOnlyList + 1)) {
      uVar24 = pSVar48->rejitReasonCounts[(long)pSVar28];
      if (uVar24 != 0) {
        swprintf_s<256ul>((WCHAR (*) [256])auStack_7a8,L"%S,",RejitReasonNames[(long)pSVar28]);
        Output::Print(L"%-40s %6d\n",(WCHAR (*) [256])auStack_7a8,
                      (ulong)pSVar48->rejitReasonCounts[(long)pSVar28]);
      }
      uVar51 = uVar51 + uVar24;
    }
    Output::Print(L"%-40s %6d\n",L"TOTAL,",(ulong)uVar51);
    Output::Print(L"\n\n");
    pSVar48 = local_50;
    if ((DAT_0145948a != 0) && (local_50->rejitStatsMap != (RejitStatsMap *)0x0)) {
      Output::Print(L"%-30s %14s %14s\n",L"Function (#),",L"Bailout Count,",L"Rejit Count");
      pRVar25 = local_50->rejitStatsMap;
      pSVar48 = local_50;
      local_40 = pRVar25;
      for (lVar42 = 0; lVar42 < pRVar25->size; lVar42 = lVar42 + 1) {
        iVar34 = (pRVar25->buckets).ptr[lVar42];
        if (iVar34 != -1) {
          iVar45 = -1;
          while (iVar2 = iVar34, iVar2 != -1) {
            pWVar43 = (pRVar25->entries).ptr;
            pPVar8 = (ParseableFunctionInfo *)
                     ((pWVar43[iVar2].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
            if (pPVar8 == (ParseableFunctionInfo *)0x0) {
              iVar34 = pWVar43[iVar2].next;
              JsUtil::
              WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
              ::RemoveEntry(local_40,iVar2,iVar45,(uint)lVar42);
              pRVar25 = local_40;
              pSVar48 = local_50;
            }
            else {
              pRVar9 = pWVar43[iVar2].value.ptr;
              for (pSVar28 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                              *)0x0; local_48 != pSVar28;
                  pSVar28 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                             *)((long)&(pSVar28->
                                       super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                       ).
                                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                                       ._vptr_ReadOnlyList + 1)) {
                pRVar9->m_totalRejits =
                     pRVar9->m_totalRejits + pRVar9->m_rejitReasonCounts[(long)pSVar28];
              }
              pBVar6 = pRVar9->m_bailoutReasonCounts;
              uVar51 = pBVar6->bucketCount;
              piVar10 = pBVar6->buckets;
              for (uVar46 = 0; uVar46 != uVar51; uVar46 = uVar46 + 1) {
                iVar34 = piVar10[uVar46];
                if (iVar34 != -1) {
                  pSVar7 = pBVar6->entries;
                  while (iVar34 != -1) {
                    lVar37 = (long)iVar34;
                    iVar34 = pSVar7[iVar34].
                             super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                             super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                             .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
                    pRVar9->m_totalBailouts =
                         pRVar9->m_totalBailouts +
                         pSVar7[lVar37].
                         super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                         super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                         .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value;
                  }
                }
              }
              local_38 = (FieldAccessStatsEntry *)
                         ParseableFunctionInfo::GetExternalDisplayName(pPVar8);
              pcVar29 = FunctionProxy::GetDebugNumberSet
                                  ((FunctionProxy *)pPVar8,(wchar (*) [42])auStack_5a8);
              swprintf_s<256ul>((WCHAR (*) [256])auStack_3a8,L"%s (%s),",local_38,pcVar29);
              Output::Print(L"%-30s %14d, %14d\n",(WCHAR (*) [256])auStack_3a8,
                            (ulong)pRVar9->m_totalBailouts,(ulong)pRVar9->m_totalRejits);
              pRVar25 = local_40;
              pSVar48 = local_50;
              iVar34 = pWVar43[iVar2].next;
              iVar45 = iVar2;
            }
          }
        }
      }
      Output::Print(L"\n\n");
      pRVar25 = pSVar48->rejitStatsMap;
      local_68 = pRVar25;
      for (pRVar47 = (RejitStatsMap *)0x0; pSVar48 = local_50,
          (long)pRVar47 <
          (long)*(int *)&((ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                           *)&pRVar25->size)->_vptr_ReadOnlyList;
          pRVar47 = (RejitStatsMap *)((long)&pRVar47->size + 1)) {
        iVar34 = *(int *)((long)&((Type *)&pRVar25->buckets)->ptr->ptr + (long)pRVar47 * 4);
        if (iVar34 != -1) {
          local_40 = pRVar47;
          iVar45 = -1;
          while (pRVar20 = local_40, iVar34 != -1) {
            pWVar11 = (pRVar25->entries).ptr;
            pWVar43 = pWVar11 + iVar34;
            pPVar8 = (ParseableFunctionInfo *)
                     ((pWVar11[iVar34].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
            if (pPVar8 == (ParseableFunctionInfo *)0x0) {
              iVar2 = pWVar43->next;
              JsUtil::
              WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
              ::RemoveEntry(pRVar25,iVar34,iVar45,(uint)local_40);
              pRVar47 = pRVar20;
              iVar34 = iVar2;
            }
            else {
              local_58 = (FieldAccessStatsByFunctionNumberMap *)CONCAT44(local_58._4_4_,iVar34);
              pFVar35 = (FieldAccessStatsEntry *)(pWVar43->value).ptr;
              local_60 = pWVar43;
              local_38 = (FieldAccessStatsEntry *)
                         ParseableFunctionInfo::GetExternalDisplayName(pPVar8);
              pcVar29 = FunctionProxy::GetDebugNumberSet
                                  ((FunctionProxy *)pPVar8,(wchar (*) [42])(rejits + 0xe));
              swprintf_s<256ul>((WCHAR (*) [256])auStack_5a8,L"%s (%s),",local_38,pcVar29);
              Output::Print(L"%-30s\n\n",(WCHAR (*) [256])auStack_5a8);
              local_38 = pFVar35;
              if (*(int *)&(pFVar35->stats).
                           super_SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>.
                           field_0xc != 0) {
                Output::Print(L"%10sBailouts:\n",L"");
                plVar5 = *(long **)&(local_38->stats).
                                    super_SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>
                                    .super_SListNodeBase<Memory::Recycler>;
                for (uVar46 = 0; uVar46 < *(uint *)((long)plVar5 + 0x1c); uVar46 = uVar46 + 1) {
                  iVar34 = *(int *)(*plVar5 + uVar46 * 4);
                  if (iVar34 != -1) {
                    while (iVar34 != -1) {
                      lVar42 = plVar5[1];
                      lVar37 = (long)iVar34;
                      uVar51 = *(uint *)(lVar42 + lVar37 * 0xc);
                      iVar34 = *(int *)(lVar42 + lVar37 * 0xc + 4);
                      if (uVar51 != 0) {
                        pcVar27 = GetBailOutKindName(*(BailOutKind *)(lVar42 + lVar37 * 0xc + 8));
                        swprintf_s<256ul>((WCHAR (*) [256])auStack_3a8,L"%S,",pcVar27);
                        Output::Print(L"%10s%-40s %6d\n",L"",(WCHAR (*) [256])auStack_3a8,
                                      (ulong)uVar51);
                      }
                    }
                  }
                  pRVar25 = local_68;
                }
              }
              Output::Print(L"\n");
              pFVar35 = local_38;
              pRVar47 = local_40;
              if ((local_38->stats).
                  super_SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>.
                  super_RealCount.count != 0) {
                Output::Print(L"%10sRejits:\n",L"");
                for (pSVar28 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                                *)0x0; local_48 != pSVar28;
                    pSVar28 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                               *)((long)&(pSVar28->
                                         super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                         ).
                                         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                                         ._vptr_ReadOnlyList + 1)) {
                  if (*(int *)((long)&(((pFVar35->functionBodyWeakRef).ptr)->
                                      super_RecyclerWeakReferenceBase).strongRef + (long)pSVar28 * 4
                              ) != 0) {
                    swprintf_s<256ul>((WCHAR (*) [256])auStack_5a8,L"%S,",
                                      RejitReasonNames[(long)pSVar28]);
                    pFVar35 = local_38;
                    Output::Print(L"%10s%-40s %6d\n",L"",(WCHAR (*) [256])auStack_5a8,
                                  (ulong)*(uint *)((long)&(((local_38->functionBodyWeakRef).ptr)->
                                                          super_RecyclerWeakReferenceBase).strongRef
                                                  + (long)pSVar28 * 4));
                  }
                }
                Output::Print(L"\n\n");
              }
              iVar34 = local_60->next;
              iVar45 = (int)local_58;
            }
          }
        }
      }
    }
  }
  ClearBailoutReasonCountsMap(pSVar48);
  ClearRejitReasonCountsArray(pSVar48);
  bVar21 = Phases::IsEnabled((Phases *)&DAT_01450888,ObjTypeSpecPhase);
  pWVar43 = (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
             *)&DAT_01450888;
  if (bVar21) {
    _nonZeroBytecodeFunctions =
         (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
          *)&DAT_01450888;
    debugStringBuffer_1[0x14] = L'\0';
    debugStringBuffer_1[0x15] = L'\0';
    debugStringBuffer_1[0x16] = L'\0';
    debugStringBuffer_1[0x17] = L'\0';
    debugStringBuffer_1[0x18] = L'\0';
    debugStringBuffer_1[0x19] = L'\0';
    debugStringBuffer_1[0xc] = L'\0';
    debugStringBuffer_1[0xd] = L'\0';
    debugStringBuffer_1[0xe] = L'\0';
    debugStringBuffer_1[0xf] = L'\0';
    debugStringBuffer_1[0x10] = L'\0';
    debugStringBuffer_1[0x11] = L'\0';
    debugStringBuffer_1[0x12] = L'\0';
    debugStringBuffer_1[0x13] = L'\0';
    debugStringBuffer_1[4] = L'\0';
    debugStringBuffer_1[5] = L'\0';
    debugStringBuffer_1[6] = L'\0';
    debugStringBuffer_1[7] = L'\0';
    debugStringBuffer_1[8] = L'\0';
    debugStringBuffer_1[9] = L'\0';
    debugStringBuffer_1[10] = L'\0';
    debugStringBuffer_1[0xb] = L'\0';
    auStack_5a8 = (undefined1  [8])0x0;
    debugStringBuffer_1[0] = L'\0';
    debugStringBuffer_1[1] = L'\0';
    debugStringBuffer_1[2] = L'\0';
    debugStringBuffer_1[3] = L'\0';
    if (pSVar48->fieldAccessStatsByFunctionNumber != (FieldAccessStatsByFunctionNumberMap *)0x0) {
      local_58 = pSVar48->fieldAccessStatsByFunctionNumber;
      puVar26 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      local_60 = (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
                  *)&DAT_01450888;
      pFVar36 = local_58;
      for (pRVar25 = (RejitStatsMap *)0x0; pRVar25 < (RejitStatsMap *)(ulong)pFVar36->bucketCount;
          pRVar25 = (RejitStatsMap *)
                    ((long)&((ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                              *)&pRVar25->size)->_vptr_ReadOnlyList + 1)) {
        iVar34 = (pFVar36->buckets).ptr[(long)pRVar25];
        if (iVar34 != -1) {
LAB_006ec81b:
          local_68 = pRVar25;
          pRVar25 = local_68;
          if (iVar34 != -1) {
            pSVar12 = (pFVar36->entries).ptr;
            local_40 = (RejitStatsMap *)
                       CONCAT44(local_40._4_4_,
                                pSVar12[iVar34].
                                super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                .
                                super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                                .
                                super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>_>
                                .
                                super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                                .next);
            local_48 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                        *)CONCAT44(local_48._4_4_,
                                   pSVar12[iVar34].
                                   super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                   .
                                   super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                                   .
                                   super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>_>
                                   .
                                   super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                                   .key);
            local_38 = pSVar12[iVar34].
                       super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .
                       super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                       .
                       super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>_>
                       .
                       super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                       .value.ptr;
            debugStringBuffer[0x14] = L'\0';
            debugStringBuffer[0x15] = L'\0';
            debugStringBuffer[0x16] = L'\0';
            debugStringBuffer[0x17] = L'\0';
            debugStringBuffer[0x18] = L'\0';
            debugStringBuffer[0x19] = L'\0';
            debugStringBuffer[0xc] = L'\0';
            debugStringBuffer[0xd] = L'\0';
            debugStringBuffer[0xe] = L'\0';
            debugStringBuffer[0xf] = L'\0';
            debugStringBuffer[0x10] = L'\0';
            debugStringBuffer[0x11] = L'\0';
            debugStringBuffer[0x12] = L'\0';
            debugStringBuffer[0x13] = L'\0';
            debugStringBuffer[4] = L'\0';
            debugStringBuffer[5] = L'\0';
            debugStringBuffer[6] = L'\0';
            debugStringBuffer[7] = L'\0';
            debugStringBuffer[8] = L'\0';
            debugStringBuffer[9] = L'\0';
            debugStringBuffer[10] = L'\0';
            debugStringBuffer[0xb] = L'\0';
            auStack_3a8 = (undefined1  [8])0x0;
            debugStringBuffer[0] = L'\0';
            debugStringBuffer[1] = L'\0';
            debugStringBuffer[2] = L'\0';
            debugStringBuffer[3] = L'\0';
            auStack_7a8 = (undefined1  [8])&local_38->stats;
            totalBuckets._0_8_ = auStack_7a8;
            do {
              if (totalBuckets._0_8_ == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar26 = 1;
                bVar21 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                             ,0x76,"(current != nullptr)","current != nullptr");
                if (!bVar21) {
LAB_006ed27c:
                  pcVar17 = (code *)invalidInstructionException();
                  (*pcVar17)();
                }
                *puVar26 = 0;
              }
              auVar19 = auStack_7a8;
              SListNodeBase<Memory::Recycler>::Next
                        ((SListNodeBase<Memory::Recycler> *)(rejits + 0xe));
              if ((undefined1  [8])stack0xfffffffffffffed8 == auVar19) goto LAB_006ec919;
              SListNodeBase<Memory::Recycler>::Next
                        ((SListNodeBase<Memory::Recycler> *)(rejits + 0xe));
              totalBuckets._0_8_ = stack0xfffffffffffffed8;
              pTVar30 = SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>::Iterator::
                        Data((Iterator *)auStack_7a8);
              FieldAccessStats::Add((FieldAccessStats *)auStack_3a8,pTVar30->ptr);
            } while( true );
          }
        }
      }
    }
    Output::Print(L"FieldAccessStats: totals\n");
    Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)auStack_5a8 & 0xffffffff,
                  (ulong)auStack_5a8 >> 0x20);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",
                  debugStringBuffer_1._0_8_ & 0xffffffff,(ulong)debugStringBuffer_1._0_8_ >> 0x20,
                  debugStringBuffer_1._44_8_ & 0xffffffff);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,debugStringBuffer_1._8_8_ & 0xffffffff,debugStringBuffer_1._24_8_ & 0xffffffff,
                  (ulong)debugStringBuffer_1._24_8_ >> 0x20,(ulong)debugStringBuffer_1._8_8_ >> 0x20
                  ,debugStringBuffer_1._16_8_ & 0xffffffff,(ulong)debugStringBuffer_1._16_8_ >> 0x20
                  ,(ulong)(uint)debugStringBuffer_1._40_4_,(ulong)(uint)debugStringBuffer_1._32_4_,
                  (ulong)(uint)debugStringBuffer_1._36_4_,(ulong)debugStringBuffer_1._44_8_ >> 0x20)
    ;
    pWVar43 = _nonZeroBytecodeFunctions;
    pSVar48 = local_50;
  }
  bVar21 = Phases::IsEnabled((Phases *)pWVar43,MissingPropertyCachePhase);
  if (bVar21) {
    Output::Print(L"MissingPropertyStats: hits = %d, misses = %d, cache attempts = %d.\n",
                  (ulong)(uint)pSVar48->missingPropertyHits,
                  (ulong)(uint)pSVar48->missingPropertyMisses,
                  (ulong)(uint)pSVar48->missingPropertyCacheAttempts);
  }
  bVar21 = Phases::IsEnabled((Phases *)&DAT_01450888,PolymorphicInlineCachePhase);
  if (bVar21) {
    Output::Print(L"%s,%s,%s,%s,%s,%s,%s,%s,%s\n",L"Function",L"Property",L"Kind",L"Accesses",
                  L"Misses",L"Miss Rate",L"Collisions",L"Collision Rate",L"Slot Count");
    pCVar13 = pSVar48->cacheDataMap;
    for (uVar46 = 0; uVar46 < pCVar13->bucketCount; uVar46 = uVar46 + 1) {
      iVar34 = (pCVar13->buckets).ptr[uVar46];
      if (iVar34 != -1) {
        while (iVar34 != -1) {
          pSVar14 = (pCVar13->entries).ptr;
          iVar45 = pSVar14[iVar34].
                   super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .
                   super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                   .
                   super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                   .
                   super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                   .next;
          pPVar15 = pSVar14[iVar34].
                    super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .
                    super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                    .
                    super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                    .
                    super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                    .key.ptr;
          (*(pPVar15->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[6])
                    (pPVar15,pSVar14[iVar34].
                             super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                             .
                             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                             .value.ptr);
          iVar34 = iVar45;
        }
      }
    }
  }
  this_00 = pSVar48->regexStatsDatabase;
  if (this_00 != (RegexStatsDatabase *)0x0) {
    w = GetRegexDebugWriter(pSVar48);
    UnifiedRegex::RegexStatsDatabase::Print(this_00,w);
  }
  Output::TraceStats(EmitterPhase,L"Script Context: 0x%p Url: %s\n",pSVar48,pSVar48->url);
  Output::TraceStats(EmitterPhase,L"  Total thread committed code size = %d\n",
                     pSVar48->threadContext->nativeCodeSize);
  Output::TraceStats(ParsePhase,L"Script Context: 0x%p Url: %s\n",pSVar48,pSVar48->url);
  Output::TraceStats(ParsePhase,L"  Total ThreadContext source size %d\n",
                     pSVar48->threadContext->sourceCodeSize);
  Output::Flush();
  return;
LAB_006ec919:
  bVar21 = Phases::IsEnabled((Phases *)local_60,ObjTypeSpecPhase);
  if ((bVar21) && (DAT_0145948a == 1)) {
    plVar5 = (long *)(((local_38->functionBodyWeakRef).ptr)->super_RecyclerWeakReferenceBase).
                     strongRef;
    pcVar44 = L"<unknown>";
    if (plVar5 != (long *)0x0) {
      pcVar44 = (char16_t *)(**(code **)(*plVar5 + 0x38))(plVar5,L"<unknown>");
    }
    Output::Print(L"FieldAccessStats: function %s (#%u): inline cache stats:\n",pcVar44,
                  (ulong)local_48 & 0xffffffff);
    Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)auStack_3a8 & 0xffffffff,
                  (ulong)auStack_3a8 >> 0x20);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",debugStringBuffer._0_8_ & 0xffffffff,
                  (ulong)debugStringBuffer._0_8_ >> 0x20,debugStringBuffer._44_8_ & 0xffffffff);
    local_48 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                *)((ulong)debugStringBuffer._16_8_ >> 0x20);
    local_38 = (FieldAccessStatsEntry *)(ulong)(uint)debugStringBuffer._40_4_;
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,debugStringBuffer._8_8_ & 0xffffffff,debugStringBuffer._24_8_ & 0xffffffff,
                  (ulong)debugStringBuffer._24_8_ >> 0x20,(ulong)debugStringBuffer._8_8_ >> 0x20,
                  debugStringBuffer._16_8_ & 0xffffffff,local_48,local_38,
                  (ulong)(uint)debugStringBuffer._32_4_,(ulong)(uint)debugStringBuffer._36_4_,
                  (ulong)debugStringBuffer._44_8_ >> 0x20);
  }
  FieldAccessStats::Add((FieldAccessStats *)auStack_5a8,(FieldAccessStats *)auStack_3a8);
  pFVar36 = local_58;
  iVar34 = (int)local_40;
  pRVar25 = local_68;
  goto LAB_006ec81b;
}

Assistant:

void ScriptContext::PrintStats()
    {

#ifdef PROFILE_TYPES
        if (Configuration::Global.flags.ProfileTypes)
        {
            ProfileTypes();
        }
#endif

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        if (Configuration::Global.flags.ProfileBailOutRecordMemory)
        {
            Output::Print(_u("CodeSize: %6d\nBailOutRecord Size: %6d\nLocalOffsets Size: %6d\n"), codeSize, bailOutRecordBytes, bailOutOffsetBytes);
        }
#endif

#ifdef PROFILE_OBJECT_LITERALS
        if (Configuration::Global.flags.ProfileObjectLiteral)
        {
            ProfileObjectLiteral();
        }
#endif

#ifdef PROFILE_STRINGS
        if (stringProfiler != nullptr)
        {
            stringProfiler->PrintAll();
            Adelete(MiscAllocator(), stringProfiler);
            stringProfiler = nullptr;
        }
#endif

#ifdef PROFILE_MEM
        if (profileMemoryDump && MemoryProfiler::IsTraceEnabled())
        {
            MemoryProfiler::PrintAll();
#ifdef PROFILE_RECYCLER_ALLOC
            if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::AllPhase)
                || Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::RunPhase))
            {
                GetRecycler()->PrintAllocStats();
            }
#endif
        }
#endif
#if DBG_DUMP
        if (PHASE_STATS1(Js::ByteCodePhase))
        {
            Output::Print(_u(" Total Bytecode size: <%d, %d, %d> = %d\n"),
                byteCodeDataSize,
                byteCodeAuxiliaryDataSize,
                byteCodeAuxiliaryContextDataSize,
                byteCodeDataSize + byteCodeAuxiliaryDataSize + byteCodeAuxiliaryContextDataSize);
        }

        if (Configuration::Global.flags.BytecodeHist)
        {
            Output::Print(_u("ByteCode Histogram\n"));
            Output::Print(_u("\n"));

            uint total = 0;
            uint unique = 0;
            for (int j = 0; j < (int)OpCode::ByteCodeLast; j++)
            {
                total += byteCodeHistogram[j];
                if (byteCodeHistogram[j] > 0)
                {
                    unique++;
                }
            }
            Output::Print(_u("%9u                     Total executed ops\n"), total);
            Output::Print(_u("\n"));

            uint max = UINT_MAX;
            double pctcume = 0.0;

            while (true)
            {
                uint upper = 0;
                int index = -1;
                for (int j = 0; j < (int)OpCode::ByteCodeLast; j++)
                {
                    if (OpCodeUtil::IsValidOpcode((OpCode)j) && byteCodeHistogram[j] > upper && byteCodeHistogram[j] < max)
                    {
                        index = j;
                        upper = byteCodeHistogram[j];
                    }
                }

                if (index == -1)
                {
                    break;
                }

                max = byteCodeHistogram[index];

                for (OpCode j = (OpCode)0; j < OpCode::ByteCodeLast; j++)
                {
                    if (OpCodeUtil::IsValidOpcode(j) && max == byteCodeHistogram[(int)j])
                    {
                        double pct = ((double)max) / total;
                        pctcume += pct;

                        Output::Print(_u("%9u  %5.1lf  %5.1lf  %04x %s\n"), max, pct * 100, pctcume * 100, j, OpCodeUtil::GetOpCodeName(j));
                    }
                }
            }
            Output::Print(_u("\n"));
            Output::Print(_u("Unique opcodes: %d\n"), unique);
        }

#endif

#if ENABLE_NATIVE_CODEGEN
#ifdef BGJIT_STATS
        // We do not care about small script contexts without much activity - unless t
        if (PHASE_STATS1(Js::BGJitPhase) && (this->interpretedCount > 50 || Js::Configuration::Global.flags.IsEnabled(Js::ForceFlag)))
        {

#define MAX_BUCKETS 15
            uint loopJitCodeUsed = 0;
            uint bucketSize1 = 20;
            uint bucketSize2 = 100;
            uint size1CutOffbucketId = 4;
            uint totalBuckets[MAX_BUCKETS] = { 0 };
            uint nativeCodeBuckets[MAX_BUCKETS] = { 0 };
            uint usedNativeCodeBuckets[MAX_BUCKETS] = { 0 };
            uint rejits[MAX_BUCKETS] = { 0 };
            uint zeroInterpretedFunctions = 0;
            uint oneInterpretedFunctions = 0;
            uint nonZeroBytecodeFunctions = 0;
            Output::Print(_u("Script Context: 0x%p Url: %s\n"), this, this->url);

            FunctionBody* anyFunctionBody = this->FindFunction([](FunctionBody* body) { return body != nullptr; });

            if (anyFunctionBody)
            {
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("Function list\n"));
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("===============================\n"));
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-24s, %-8s, %-10s, %-10s, %-10s, %-10s, %-10s\n"), _u("Function"), _u("InterpretedCount"), _u("ByteCodeInLoopSize"), _u("ByteCodeSize"), _u("IsJitted"), _u("IsUsed"), _u("NativeCodeSize"));

                this->MapFunction([&](FunctionBody* body)
                {
                    bool isNativeCode = false;

                    // Filtering interpreted count lowers a lot of noise
                    if (body->GetInterpretedCount() > 1 || Js::Configuration::Global.flags.IsEnabled(Js::ForceFlag))
                    {
                        body->MapEntryPoints([&](uint entryPointIndex, FunctionEntryPointInfo* entryPoint)
                        {
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                            char rejit = entryPointIndex > 0 ? '*' : ' ';
                            isNativeCode = entryPoint->IsNativeCode() | isNativeCode;
                            OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"),
                                body->GetExternalDisplayName(),
                                body->GetDebugNumberSet(debugStringBuffer),
                                rejit,
                                body->GetInterpretedCount(),
                                body->GetByteCodeInLoopCount(),
                                body->GetByteCodeCount(),
                                entryPoint->IsNativeCode() ? _u("Jitted") : _u("Interpreted"),
                                body->GetNativeEntryPointUsed() ? _u("Used") : _u("NotUsed"),
                                entryPoint->IsNativeCode() ? entryPoint->GetCodeSize() : 0);
                        });
                    }
                    if (body->GetInterpretedCount() == 0)
                    {
                        zeroInterpretedFunctions++;
                        if (body->GetByteCodeCount() > 0)
                        {
                            nonZeroBytecodeFunctions++;
                        }
                    }
                    else if (body->GetInterpretedCount() == 1)
                    {
                        oneInterpretedFunctions++;
                    }


                    // Generate a histogram using interpreted counts.
                    uint bucket;
                    uint intrpCount = body->GetInterpretedCount();
                    if (intrpCount < 100)
                    {
                        bucket = intrpCount / bucketSize1;
                    }
                    else if (intrpCount < 1000)
                    {
                        bucket = size1CutOffbucketId  + intrpCount / bucketSize2;
                    }
                    else
                    {
                        bucket = MAX_BUCKETS - 1;
                    }

                    // Explicitly assume that the bucket count is less than the following counts (which are all equal)
                    // This is because min will return MAX_BUCKETS - 1 if the count exceeds MAX_BUCKETS - 1.
                    __analysis_assume(bucket < MAX_BUCKETS);

                    totalBuckets[bucket]++;
                    if (isNativeCode)
                    {
                        nativeCodeBuckets[bucket]++;
                        if (body->GetNativeEntryPointUsed())
                        {
                            usedNativeCodeBuckets[bucket]++;
                        }
                        if (body->HasRejit())
                        {
                            rejits[bucket]++;
                        }
                    }

                    body->MapLoopHeaders([&](uint loopNumber, LoopHeader* header)
                    {
                        char16 loopBodyName[256];
                        body->GetLoopBodyName(loopNumber, loopBodyName, _countof(loopBodyName));
                        header->MapEntryPoints([&](int index, LoopEntryPointInfo * entryPoint)
                        {
                            if (entryPoint->IsNativeCode())
                            {
                                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                                char rejit = index > 0 ? '*' : ' ';
                                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"),
                                    loopBodyName,
                                    body->GetDebugNumberSet(debugStringBuffer),
                                    rejit,
                                    header->interpretCount,
                                    header->GetByteCodeCount(),
                                    header->GetByteCodeCount(),
                                    _u("Jitted"),
                                    entryPoint->IsUsed() ? _u("Used") : _u("NotUsed"),
                                    entryPoint->GetCodeSize());
                                if (entryPoint->IsUsed())
                                {
                                    loopJitCodeUsed++;
                                }
                            }
                        });
                    });
                });
            }

            Output::Print(_u("**  SpeculativelyJitted: %6d FunctionsJitted: %6d JittedUsed: %6d Usage:%f ByteCodesJitted: %6d JitCodeUsed: %6d Usage: %f \n"),
                speculativeJitCount, funcJITCount, funcJitCodeUsed, ((float)(funcJitCodeUsed) / funcJITCount) * 100, bytecodeJITCount, jitCodeUsed, ((float)(jitCodeUsed) / bytecodeJITCount) * 100);
            Output::Print(_u("** LoopJITCount: %6d LoopJitCodeUsed: %6d Usage: %f\n"),
                loopJITCount, loopJitCodeUsed, ((float)loopJitCodeUsed / loopJITCount) * 100);
            Output::Print(_u("** TotalInterpretedCalls: %6d MaxFuncInterp: %6d  InterpretedHighPri: %6d \n"),
                interpretedCount, maxFuncInterpret, interpretedCallsHighPri);
            Output::Print(_u("** ZeroInterpretedFunctions: %6d OneInterpretedFunctions: %6d ZeroInterpretedWithNonZeroBytecode: %6d \n "), zeroInterpretedFunctions, oneInterpretedFunctions, nonZeroBytecodeFunctions);
            Output::Print(_u("** %-24s : %-10s %-10s %-10s %-10s %-10s\n"), _u("InterpretedCounts"), _u("Total"), _u("NativeCode"), _u("Used"), _u("Usage"), _u("Rejits"));
            uint low = 0;
            uint high = 0;
            for (uint i = 0; i < _countof(totalBuckets); i++)
            {
                low = high;
                if (i <= size1CutOffbucketId)
                {
                    high = low + bucketSize1;
                }
                else if (i < (_countof(totalBuckets) - 1))
                {
                    high = low + bucketSize2;               }
                else
                {
                    high = 100000;
                }
                Output::Print(_u("** %10d - %10d : %10d %10d %10d %7.2f %10d\n"), low, high, totalBuckets[i], nativeCodeBuckets[i], usedNativeCodeBuckets[i], ((float)usedNativeCodeBuckets[i] / nativeCodeBuckets[i]) * 100, rejits[i]);
            }
            Output::Print(_u("\n\n"));
        }
#undef MAX_BUCKETS
#endif

#ifdef REJIT_STATS
        if (PHASE_STATS1(Js::ReJITPhase))
        {
            uint totalBailouts = 0;
            uint totalRejits = 0;
            WCHAR buf[256];

            // Dump bailout data.
            Output::Print(_u("%-40s %6s\n"), _u("Bailout Reason,"), _u("Count"));

            bailoutReasonCounts->Map([&totalBailouts](uint kind, uint val) {
                WCHAR buf[256];
                totalBailouts += val;
                if (val != 0)
                {
                    swprintf_s(buf, _u("%S,"), GetBailOutKindName((IR::BailOutKind)kind));
                    Output::Print(_u("%-40s %6d\n"), buf, val);
                }
            });


            Output::Print(_u("%-40s %6d\n"), _u("TOTAL,"), totalBailouts);
            Output::Print(_u("\n\n"));

            // Dump rejit data.
            Output::Print(_u("%-40s %6s\n"), _u("Rejit Reason,"), _u("Count"));
            for (uint i = 0; i < NumRejitReasons; ++i)
            {
                totalRejits += rejitReasonCounts[i];
                if (rejitReasonCounts[i] != 0)
                {
                    swprintf_s(buf, _u("%S,"), RejitReasonNames[i]);
                    Output::Print(_u("%-40s %6d\n"), buf, rejitReasonCounts[i]);
                }
            }
            Output::Print(_u("%-40s %6d\n"), _u("TOTAL,"), totalRejits);
            Output::Print(_u("\n\n"));

            // If in verbose mode, dump data for each FunctionBody
            if (CONFIG_FLAG(Verbose) && rejitStatsMap != nullptr)
            {
                // Aggregated data
                Output::Print(_u("%-30s %14s %14s\n"), _u("Function (#),"), _u("Bailout Count,"), _u("Rejit Count"));
                rejitStatsMap->Map([](Js::FunctionBody const *body, RejitStats *stats, RecyclerWeakReference<const Js::FunctionBody> const*) {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    for (uint i = 0; i < NumRejitReasons; ++i)
                        stats->m_totalRejits += stats->m_rejitReasonCounts[i];

                    stats->m_bailoutReasonCounts->Map([stats](uint kind, uint val) {
                        stats->m_totalBailouts += val;
                    });

                    WCHAR buf[256];

                    swprintf_s(buf, _u("%s (%s),"), body->GetExternalDisplayName(), (const_cast<Js::FunctionBody*>(body))->GetDebugNumberSet(debugStringBuffer)); //TODO Kount
                    Output::Print(_u("%-30s %14d, %14d\n"), buf, stats->m_totalBailouts, stats->m_totalRejits);

                });
                Output::Print(_u("\n\n"));

                // Per FunctionBody data
                rejitStatsMap->Map([](Js::FunctionBody const *body, RejitStats *stats, RecyclerWeakReference<const Js::FunctionBody> const *) {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    WCHAR buf[256];

                    swprintf_s(buf, _u("%s (%s),"), body->GetExternalDisplayName(), (const_cast<Js::FunctionBody*>(body))->GetDebugNumberSet(debugStringBuffer)); //TODO Kount
                    Output::Print(_u("%-30s\n\n"), buf);

                    // Dump bailout data
                    if (stats->m_totalBailouts != 0)
                    {
                        Output::Print(_u("%10sBailouts:\n"), _u(""));

                        stats->m_bailoutReasonCounts->Map([](uint kind, uint val) {
                            if (val != 0)
                            {
                                WCHAR buf[256];
                                swprintf_s(buf, _u("%S,"), GetBailOutKindName((IR::BailOutKind)kind));
                                Output::Print(_u("%10s%-40s %6d\n"), _u(""), buf, val);
                            }
                        });
                    }
                    Output::Print(_u("\n"));

                    // Dump rejit data.
                    if (stats->m_totalRejits != 0)
                    {
                        Output::Print(_u("%10sRejits:\n"), _u(""));
                        for (uint i = 0; i < NumRejitReasons; ++i)
                        {
                            if (stats->m_rejitReasonCounts[i] != 0)
                            {
                                swprintf_s(buf, _u("%S,"), RejitReasonNames[i]);
                                Output::Print(_u("%10s%-40s %6d\n"), _u(""), buf, stats->m_rejitReasonCounts[i]);
                            }
                        }
                        Output::Print(_u("\n\n"));
                    }
                });

            }
        }

        this->ClearBailoutReasonCountsMap();
        this->ClearRejitReasonCountsArray();
#endif

#ifdef FIELD_ACCESS_STATS
    if (PHASE_STATS1(Js::ObjTypeSpecPhase))
    {
        FieldAccessStats globalStats;
        if (this->fieldAccessStatsByFunctionNumber != nullptr)
        {
            this->fieldAccessStatsByFunctionNumber->Map([&globalStats](uint functionNumber, FieldAccessStatsEntry* entry)
            {
                FieldAccessStats functionStats;
                entry->stats.Map([&functionStats](FieldAccessStatsPtr entryPointStats)
                {
                    functionStats.Add(entryPointStats);
                });

                if (PHASE_VERBOSE_STATS1(Js::ObjTypeSpecPhase))
                {
                    FunctionBody* functionBody = entry->functionBodyWeakRef->Get();
                    const char16* functionName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                    Output::Print(_u("FieldAccessStats: function %s (#%u): inline cache stats:\n"), functionName, functionNumber);
                    Output::Print(_u("    overall: total %u, no profile info %u\n"), functionStats.totalInlineCacheCount, functionStats.noInfoInlineCacheCount);
                    Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                        functionStats.monoInlineCacheCount, functionStats.emptyMonoInlineCacheCount, functionStats.clonedMonoInlineCacheCount);
                    Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                        functionStats.polyInlineCacheCount, functionStats.highUtilPolyInlineCacheCount, functionStats.lowUtilPolyInlineCacheCount,
                        functionStats.nullPolyInlineCacheCount, functionStats.emptyPolyInlineCacheCount, functionStats.ignoredPolyInlineCacheCount, functionStats.disabledPolyInlineCacheCount,
                        functionStats.equivPolyInlineCacheCount, functionStats.nonEquivPolyInlineCacheCount, functionStats.clonedPolyInlineCacheCount);
                }

                globalStats.Add(&functionStats);
            });
        }

        Output::Print(_u("FieldAccessStats: totals\n"));
        Output::Print(_u("    overall: total %u, no profile info %u\n"), globalStats.totalInlineCacheCount, globalStats.noInfoInlineCacheCount);
        Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
            globalStats.monoInlineCacheCount, globalStats.emptyMonoInlineCacheCount, globalStats.clonedMonoInlineCacheCount);
        Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
            globalStats.polyInlineCacheCount, globalStats.highUtilPolyInlineCacheCount, globalStats.lowUtilPolyInlineCacheCount,
            globalStats.nullPolyInlineCacheCount, globalStats.emptyPolyInlineCacheCount, globalStats.ignoredPolyInlineCacheCount, globalStats.disabledPolyInlineCacheCount,
            globalStats.equivPolyInlineCacheCount, globalStats.nonEquivPolyInlineCacheCount, globalStats.clonedPolyInlineCacheCount);
    }
#endif

#ifdef MISSING_PROPERTY_STATS
    if (PHASE_STATS1(Js::MissingPropertyCachePhase))
    {
        Output::Print(_u("MissingPropertyStats: hits = %d, misses = %d, cache attempts = %d.\n"),
            this->missingPropertyHits, this->missingPropertyMisses, this->missingPropertyCacheAttempts);
    }
#endif


#ifdef INLINE_CACHE_STATS
        if (PHASE_STATS1(Js::PolymorphicInlineCachePhase))
        {
            Output::Print(_u("%s,%s,%s,%s,%s,%s,%s,%s,%s\n"), _u("Function"), _u("Property"), _u("Kind"), _u("Accesses"), _u("Misses"), _u("Miss Rate"), _u("Collisions"), _u("Collision Rate"), _u("Slot Count"));
            cacheDataMap->Map([this](Js::PolymorphicInlineCache const *cache, InlineCacheData *data) {
                cache->PrintStats(data);
            });
        }
#endif

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (regexStatsDatabase != 0)
            regexStatsDatabase->Print(GetRegexDebugWriter());
#endif
        OUTPUT_STATS(Js::EmitterPhase, _u("Script Context: 0x%p Url: %s\n"), this, this->url);
        OUTPUT_STATS(Js::EmitterPhase, _u("  Total thread committed code size = %d\n"), this->GetThreadContext()->GetCodeSize());

        OUTPUT_STATS(Js::ParsePhase, _u("Script Context: 0x%p Url: %s\n"), this, this->url);
        OUTPUT_STATS(Js::ParsePhase, _u("  Total ThreadContext source size %d\n"), this->GetThreadContext()->GetSourceSize());
#endif

#ifdef ENABLE_BASIC_TELEMETRY
        if (this->telemetry != nullptr)
        {
            // If an exception (e.g. out-of-memory) happens during InitializeAllocations then `this->telemetry` will be null and the Close method will still be called, hence this guard expression.
            this->telemetry->OutputPrint();
        }
#endif

        Output::Flush();
    }